

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

Gia_Man_t * Gia_ManDeriveDup(Gia_Man_t *p,int nPisNew)

{
  Gia_Man_t *p_00;
  int iVar1;
  bool bVar2;
  
  p_00 = Gia_ManDup(p);
  iVar1 = 0;
  if (0 < nPisNew) {
    iVar1 = nPisNew;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    Gia_ManAppendCi(p_00);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDeriveDup( Gia_Man_t * p, int nPisNew )
{
    int i;
    Gia_Man_t * pNew = Gia_ManDup(p);
    for ( i = 0; i < nPisNew; i++ )
        Gia_ManAppendCi( pNew );
    return pNew;
}